

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O3

void __thiscall
merlin::graphical_model::graphical_model
          (graphical_model *this,vector<merlin::factor,_std::allocator<merlin::factor>_> *fs)

{
  graph::graph(&this->super_graph,0);
  this->_vptr_graphical_model = (_func_int **)&PTR__graphical_model_00190a10;
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector(&this->m_factors,fs);
  (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_vadj).
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_vadj).
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vadj).
  super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  factor::factor(&this->m_global_const,1.0);
  fixup(this);
  return;
}

Assistant:

graphical_model(std::vector<factor> fs) :
			graph(), m_factors(fs), m_vadj(), m_dims() {
		fixup();
	}